

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Get
          (PersistentStorageJson *this,RegistrarId *aId,BorderRouter *aRetValue)

{
  Network *this_00;
  Status SVar1;
  int iVar2;
  ulong uVar3;
  undefined1 local_e0 [8];
  Domain dom;
  Network nwk;
  string local_48;
  Status local_21;
  BorderRouter *pBStack_20;
  Status status;
  BorderRouter *aRetValue_local;
  RegistrarId *aId_local;
  PersistentStorageJson *this_local;
  
  pBStack_20 = aRetValue;
  aRetValue_local = (BorderRouter *)aId;
  aId_local = (RegistrarId *)this;
  std::__cxx11::string::string((string *)&local_48,(string *)JSON_BR_abi_cxx11_);
  SVar1 = GetId<ot::commissioner::persistent_storage::BorderRouter,ot::commissioner::persistent_storage::BorderRouterId>
                    (this,aId,aRetValue,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  local_21 = SVar1;
  if ((SVar1 == kSuccess) && ((pBStack_20->mNetworkId).mId != 0xffffffff)) {
    this_00 = (Network *)((long)&dom.mName.field_2 + 8);
    Network::Network(this_00);
    iVar2 = (*(this->super_PersistentStorage)._vptr_PersistentStorage[0xe])
                      (this,&pBStack_20->mNetworkId,this_00);
    local_21 = (Status)iVar2;
    if (local_21 == kSuccess) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::operator=((string *)&(pBStack_20->mAgent).mNetworkName,(string *)&nwk)
        ;
        (pBStack_20->mAgent).mPresentFlags = (pBStack_20->mAgent).mPresentFlags | 0x10;
      }
      if (nwk.mName.field_2._8_8_ != 0) {
        (pBStack_20->mAgent).mExtendedPanId = nwk.mName.field_2._8_8_;
        (pBStack_20->mAgent).mPresentFlags = (pBStack_20->mAgent).mPresentFlags | 0x20;
      }
      if (dom.mName.field_2._12_4_ != -1) {
        Domain::Domain((Domain *)local_e0);
        iVar2 = (*(this->super_PersistentStorage)._vptr_PersistentStorage[0xd])
                          (this,(undefined1 *)((long)&dom.mName.field_2 + 0xc),local_e0);
        local_21 = (Status)iVar2;
        if ((local_21 == kSuccess) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
          std::__cxx11::string::operator=
                    ((string *)&(pBStack_20->mAgent).mDomainName,(string *)&dom);
          (pBStack_20->mAgent).mPresentFlags = (pBStack_20->mAgent).mPresentFlags | 0x1000;
        }
        Domain::~Domain((Domain *)local_e0);
      }
    }
    Network::~Network((Network *)((long)&dom.mName.field_2 + 8));
  }
  return local_21;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Get(BorderRouterId const &aId, BorderRouter &aRetValue)
{
    Status status = GetId<BorderRouter, BorderRouterId>(aId, aRetValue, JSON_BR);

    if (status == Status::kSuccess && aRetValue.mNetworkId.mId != EMPTY_ID)
    {
        Network nwk;
        status = Get(aRetValue.mNetworkId, nwk);
        if (status == Status::kSuccess)
        {
            if (!nwk.mName.empty())
            {
                aRetValue.mAgent.mNetworkName = nwk.mName;
                aRetValue.mAgent.mPresentFlags |= BorderAgent::kNetworkNameBit;
            }
            if (nwk.mXpan != 0)
            {
                aRetValue.mAgent.mExtendedPanId = nwk.mXpan;
                aRetValue.mAgent.mPresentFlags |= BorderAgent::kExtendedPanIdBit;
            }
            if (nwk.mDomainId.mId != EMPTY_ID)
            {
                Domain dom;
                status = Get(nwk.mDomainId, dom);
                if (status == Status::kSuccess && !dom.mName.empty())
                {
                    aRetValue.mAgent.mDomainName = dom.mName;
                    aRetValue.mAgent.mPresentFlags |= BorderAgent::kDomainNameBit;
                }
            }
        }
    }

    return status;
}